

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

bitset_container_t * container_to_bitset(container_t *c,uint8_t typecode)

{
  ushort uVar1;
  ulong uVar2;
  bitset_container_t *pbVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 1) {
    return (bitset_container_t *)c;
  }
  if (iVar5 == 3) {
    pbVar3 = bitset_container_from_run((run_container_t *)c);
    return pbVar3;
  }
  pbVar3 = bitset_container_create();
  uVar6 = 0;
  uVar4 = (ulong)*c;
  if ((int)*c < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = *(ushort *)(*(long *)((long)c + 8) + uVar6 * 2);
    uVar2 = pbVar3->words[uVar1 >> 6];
    uVar7 = uVar2 | 1L << ((ulong)uVar1 & 0x3f);
    pbVar3->cardinality = pbVar3->cardinality + (int)((uVar2 ^ uVar7) >> ((byte)uVar1 & 0x3f));
    pbVar3->words[uVar1 >> 6] = uVar7;
  }
  return pbVar3;
}

Assistant:

static inline bitset_container_t *container_to_bitset(container_t *c,
                                                      uint8_t typecode) {
    bitset_container_t *result = NULL;
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return CAST_bitset(c);  // nothing to do
        case ARRAY_CONTAINER_TYPE:
            result = bitset_container_from_array(CAST_array(c));
            return result;
        case RUN_CONTAINER_TYPE:
            result = bitset_container_from_run(CAST_run(c));
            return result;
        case SHARED_CONTAINER_TYPE:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}